

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::ChannelsMerge(ImDrawList *this)

{
  ImDrawChannel *pIVar1;
  unsigned_short *__src;
  ImDrawCmd *__dest;
  unsigned_short *__dest_00;
  long lVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ImDrawCmd *pIVar12;
  int iVar13;
  
  if (1 < this->_ChannelsCount) {
    iVar13 = 0;
    ChannelsSetCurrent(this,0);
    uVar6 = (this->CmdBuffer).Size;
    uVar7 = 0;
    if ((ulong)uVar6 != 0) {
      if ((int)uVar6 < 1) {
LAB_0019dd7e:
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                      ,0x4ca,"value_type &ImVector<ImDrawCmd>::back() [T = ImDrawCmd]");
      }
      uVar7 = uVar6;
      if ((this->CmdBuffer).Data[(ulong)uVar6 - 1].ElemCount == 0) {
        (this->CmdBuffer).Size = uVar6 - 1;
        uVar7 = uVar6 - 1;
      }
    }
    iVar9 = this->_ChannelsCount;
    iVar4 = 0;
    if (1 < (long)iVar9) {
      uVar6 = (this->_Channels).Size;
      pIVar1 = (this->_Channels).Data;
      uVar3 = 1;
      if (1 < (int)uVar6) {
        uVar3 = (ulong)uVar6;
      }
      iVar4 = 0;
      lVar5 = 0x20;
      iVar13 = 0;
      do {
        if (uVar3 * 0x20 == lVar5) goto LAB_0019dd5f;
        uVar6 = *(uint *)((long)&(pIVar1->CmdBuffer).Size + lVar5);
        if ((ulong)uVar6 == 0) {
          uVar6 = 0;
        }
        else {
          if ((int)uVar6 < 1) goto LAB_0019dd7e;
          if (*(int *)(*(long *)((long)&(pIVar1->CmdBuffer).Data + lVar5) + -0x30 +
                      (ulong)uVar6 * 0x30) == 0) {
            uVar6 = uVar6 - 1;
            *(uint *)((long)&(pIVar1->CmdBuffer).Size + lVar5) = uVar6;
          }
        }
        iVar4 = iVar4 + uVar6;
        iVar13 = iVar13 + *(int *)((long)&(pIVar1->IdxBuffer).Size + lVar5);
        lVar5 = lVar5 + 0x20;
      } while ((long)iVar9 * 0x20 != lVar5);
      uVar7 = (this->CmdBuffer).Size;
    }
    iVar8 = uVar7 + iVar4;
    iVar9 = (this->CmdBuffer).Capacity;
    if (iVar9 < iVar8) {
      if (iVar9 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar9 / 2 + iVar9;
      }
      if (iVar9 <= iVar8) {
        iVar9 = iVar8;
      }
      __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar9 * 0x30);
      pIVar12 = (this->CmdBuffer).Data;
      if (pIVar12 != (ImDrawCmd *)0x0) {
        memcpy(__dest,pIVar12,(long)(this->CmdBuffer).Size * 0x30);
        ImGui::MemFree((this->CmdBuffer).Data);
      }
      (this->CmdBuffer).Data = __dest;
      (this->CmdBuffer).Capacity = iVar9;
    }
    (this->CmdBuffer).Size = iVar8;
    lVar5 = (long)(this->IdxBuffer).Size + (long)iVar13;
    iVar9 = (this->IdxBuffer).Capacity;
    iVar10 = (int)lVar5;
    if (iVar9 < iVar10) {
      if (iVar9 == 0) {
        iVar9 = 8;
      }
      else {
        iVar9 = iVar9 / 2 + iVar9;
      }
      if (iVar9 <= iVar10) {
        iVar9 = iVar10;
      }
      __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar9 * 2);
      __src = (this->IdxBuffer).Data;
      if (__src != (unsigned_short *)0x0) {
        memcpy(__dest_00,__src,(long)(this->IdxBuffer).Size * 2);
        ImGui::MemFree((this->IdxBuffer).Data);
      }
      (this->IdxBuffer).Data = __dest_00;
      (this->IdxBuffer).Capacity = iVar9;
      iVar8 = (this->CmdBuffer).Size;
    }
    else {
      __dest_00 = (this->IdxBuffer).Data;
    }
    (this->IdxBuffer).Size = iVar10;
    pIVar12 = (this->CmdBuffer).Data;
    this->_IdxWritePtr = __dest_00 + (lVar5 - iVar13);
    if (1 < this->_ChannelsCount) {
      pIVar12 = pIVar12 + ((long)iVar8 - (long)iVar4);
      lVar5 = 1;
      lVar11 = 0x38;
      do {
        if ((this->_Channels).Size <= lVar5) {
LAB_0019dd5f:
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                        ,0x4c0,
                        "value_type &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
        }
        pIVar1 = (this->_Channels).Data;
        lVar2 = (long)*(int *)((long)pIVar1 + lVar11 + -0x18);
        if (lVar2 != 0) {
          memcpy(pIVar12,*(void **)((long)pIVar1 + lVar11 + -0x10),lVar2 * 0x30);
          pIVar12 = pIVar12 + lVar2;
        }
        lVar2 = (long)*(int *)((long)pIVar1 + lVar11 + -8);
        if (lVar2 != 0) {
          memcpy(this->_IdxWritePtr,*(void **)((long)&(pIVar1->CmdBuffer).Size + lVar11),lVar2 * 2);
          this->_IdxWritePtr = this->_IdxWritePtr + lVar2;
        }
        lVar5 = lVar5 + 1;
        lVar11 = lVar11 + 0x20;
      } while (lVar5 < this->_ChannelsCount);
    }
    UpdateClipRect(this);
    this->_ChannelsCount = 1;
  }
  return;
}

Assistant:

void ImDrawList::ChannelsMerge()
{
    // Note that we never use or rely on channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_ChannelsCount <= 1)
        return;

    ChannelsSetCurrent(0);
    if (CmdBuffer.Size && CmdBuffer.back().ElemCount == 0)
        CmdBuffer.pop_back();

    int new_cmd_buffer_count = 0, new_idx_buffer_count = 0;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (ch.CmdBuffer.Size && ch.CmdBuffer.back().ElemCount == 0)
            ch.CmdBuffer.pop_back();
        new_cmd_buffer_count += ch.CmdBuffer.Size;
        new_idx_buffer_count += ch.IdxBuffer.Size;
    }
    CmdBuffer.resize(CmdBuffer.Size + new_cmd_buffer_count);
    IdxBuffer.resize(IdxBuffer.Size + new_idx_buffer_count);

    ImDrawCmd* cmd_write = CmdBuffer.Data + CmdBuffer.Size - new_cmd_buffer_count;
    _IdxWritePtr = IdxBuffer.Data + IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _ChannelsCount; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch.CmdBuffer.Size) { memcpy(cmd_write, ch.CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch.IdxBuffer.Size) { memcpy(_IdxWritePtr, ch.IdxBuffer.Data, sz * sizeof(ImDrawIdx)); _IdxWritePtr += sz; }
    }
    UpdateClipRect(); // We call this instead of AddDrawCmd(), so that empty channels won't produce an extra draw call.
    _ChannelsCount = 1;
}